

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xunit.h
# Opt level: O1

void __thiscall bandit::reporter::xunit::test_run_complete(xunit *this)

{
  ostream *poVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  double local_28;
  
  std::__ostream_insert<char,std::char_traits<char>>
            (this->stm_,"<?xml version=\"1.0\" encoding=\"utf-8\"?>\n",0x27);
  poVar1 = this->stm_;
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,"<testsuite name=\"bandit\" tests=\"",0x20);
  poVar1 = (ostream *)
           std::ostream::operator<<((ostream *)poVar1,(this->super_progress_base).specs_run_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\" errors=\"0\" failures=\"",0x17);
  poVar1 = (ostream *)
           std::ostream::operator<<((ostream *)poVar1,(this->super_progress_base).specs_failed_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\"",1);
  if (0 < (this->super_progress_base).specs_skipped_) {
    poVar1 = this->stm_;
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," skipped=\"",10);
    poVar1 = (ostream *)
             std::ostream::operator<<((ostream *)poVar1,(this->super_progress_base).specs_skipped_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\"",1);
  }
  local_28 = (double)(this->testsuite_runtime_).__r / 1000000000.0;
  poVar1 = this->stm_;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," time=\"",7);
  __gnu_cxx::__to_xstring<std::__cxx11::string,char>(&local_48,vsnprintf,0x148,"%f",local_28);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,local_48._M_dataplus._M_p,local_48._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\">\n",3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  poVar1 = this->stm_;
  std::__cxx11::stringbuf::str();
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,local_48._M_dataplus._M_p,local_48._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>(this->stm_,"</testsuite>\n",0xd);
  return;
}

Assistant:

void test_run_complete() override {
        stm_ << "<?xml version=\"1.0\" encoding=\"utf-8\"?>\n";
        stm_ << "<testsuite name=\"bandit\" tests=\"" << specs_run_ << "\" errors=\"0\" failures=\""
             << specs_failed_ << "\"";

        if (specs_skipped_ > 0) {
          stm_ << " skipped=\"" << specs_skipped_ << "\"";
        }

        std::chrono::duration<double> dur_in_sec(testsuite_runtime_);
        stm_ << " time=\"" << std::to_string(dur_in_sec.count()) << "\">\n";

        stm_ << work_stm_.str();

        stm_ << "</testsuite>\n";
      }